

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogger.cpp
# Opt level: O3

void __thiscall
SLogLib::FileLogger::_WriteMessages
          (FileLogger *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *messages)

{
  pointer pbVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  runtime_error *this_00;
  recursive_mutex *__mutex;
  FileLoggerPriv *pFVar5;
  string *_message;
  pointer pbVar6;
  stringstream _stream;
  string asStack_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  __mutex = &this->mPriv->mFileWriteMutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    pFVar5 = this->mPriv;
    if (((&pFVar5->field_0x20)[*(long *)(*(long *)pFVar5 + -0x18)] & 5) != 0) {
      std::ofstream::open((char *)pFVar5,(_Ios_Openmode)(pFVar5->mFileName)._M_dataplus._M_p);
      pFVar5 = this->mPriv;
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') goto LAB_0010759c;
    }
    pbVar6 = (messages->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (messages->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar6 != pbVar1) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this->mPriv,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar1);
      pFVar5 = this->mPriv;
    }
    if (pFVar5->mHasAutoFlush != false) {
      FlushDevice(this);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar3);
LAB_0010759c:
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"SLogLib: Unable to open ",0x18);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->mPriv->mFileName)._M_dataplus._M_p,
                      (this->mPriv->mFileName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," for writing.",0xd);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1d8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FileLogger::_WriteMessages(const std::vector<std::string>& messages)
{
	std::lock_guard<std::recursive_mutex> _lock(mPriv->mFileWriteMutex);
	
	if(!mPriv->mFileHandle)
	{
		mPriv->mFileHandle.open(mPriv->mFileName.c_str());
		if(!mPriv->mFileHandle.is_open())
		{
			std::stringstream _stream;
			_stream << "SLogLib: Unable to open " << mPriv->mFileName << " for writing.";
			throw std::runtime_error(_stream.str());
		}
	}
	
	for(const std::string& _message : messages)
	{
		mPriv->mFileHandle << _message;
	}
	
	if(mPriv->mHasAutoFlush)
	{
		FlushDevice();
	}
}